

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::
Matcher<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>_>
::Matcher(Matcher<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>_>
          *this,BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>
                value)

{
  MatcherBase<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>_>
  local_30;
  BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39> local_18;
  
  (this->
  super_MatcherBase<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>_>
  ).impl_.value_ =
       (MatcherInterface<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>_>
        *)0x0;
  (this->
  super_MatcherBase<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>_>
  ).impl_.link_.next_ =
       &(this->
        super_MatcherBase<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>_>
        ).impl_.link_;
  (this->
  super_MatcherBase<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>_>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001c9830;
  local_18.super_ExprBase.impl_ =
       (ExprBase)
       (ExprBase)value.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_;
  internal::EqMatcher::operator_cast_to_Matcher
            ((Matcher<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>_>
              *)&local_30,(EqMatcher *)&local_18);
  internal::
  linked_ptr<const_testing::MatcherInterface<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>_>_>
  ::operator=(&(this->
               super_MatcherBase<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>_>
               ).impl_,&local_30.impl_);
  internal::
  MatcherBase<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>_>
  ::~MatcherBase(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }